

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O3

OPTIONHANDLER_HANDLE amqp_messenger_retrieve_options(AMQP_MESSENGER_HANDLE messenger_handle)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle;
  OPTIONHANDLER_HANDLE handle_00;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "Invalid argument (messenger_handle is NULL)";
      iVar3 = 0x612;
LAB_0013d5cc:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"amqp_messenger_retrieve_options",iVar3,1,pcVar4);
      return (OPTIONHANDLER_HANDLE)0x0;
    }
  }
  else {
    handle = OptionHandler_Create
                       (amqp_messenger_clone_option,amqp_messenger_destroy_option,
                        amqp_messenger_set_option);
    if (handle == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "Failed to retrieve options from messenger instance (OptionHandler_Create failed)";
        iVar3 = 0x61b;
        goto LAB_0013d5cc;
      }
    }
    else {
      handle_00 = message_queue_retrieve_options(messenger_handle->send_queue);
      if (handle_00 == (OPTIONHANDLER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"amqp_messenger_retrieve_options",0x624,1,
                    "failed to retrieve options from send queue)");
        }
      }
      else {
        OVar1 = OptionHandler_AddOption(handle,"amqp_message_queue_options",handle_00);
        if (OVar1 == OPTIONHANDLER_OK) {
          return handle;
        }
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"amqp_messenger_retrieve_options",0x62a,1,"failed adding option \'%s\'",
                    "amqp_message_queue_options");
        }
        OptionHandler_Destroy(handle_00);
      }
      OptionHandler_Destroy(handle);
    }
  }
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

OPTIONHANDLER_HANDLE amqp_messenger_retrieve_options(AMQP_MESSENGER_HANDLE messenger_handle)
{
    OPTIONHANDLER_HANDLE result;

    if (messenger_handle == NULL)
    {
        LogError("Invalid argument (messenger_handle is NULL)");
        result = NULL;
    }
    else
    {
        result = OptionHandler_Create(amqp_messenger_clone_option, amqp_messenger_destroy_option, (pfSetOption)amqp_messenger_set_option);

        if (result == NULL)
        {
            LogError("Failed to retrieve options from messenger instance (OptionHandler_Create failed)");
        }
        else
        {
            AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;
            OPTIONHANDLER_HANDLE mq_options;

            if ((mq_options = message_queue_retrieve_options(instance->send_queue)) == NULL)
            {
                LogError("failed to retrieve options from send queue)");
                OptionHandler_Destroy(result);
                result = NULL;
            }
            else if (OptionHandler_AddOption(result, MESSENGER_SAVED_MQ_OPTIONS, (void*)mq_options) != OPTIONHANDLER_OK)
            {
                LogError("failed adding option '%s'", MESSENGER_SAVED_MQ_OPTIONS);
                OptionHandler_Destroy(mq_options);
                OptionHandler_Destroy(result);
                result = NULL;
            }
        }
    }

    return result;
}